

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

void fmt::v5::vprint<char[3],char>
               (FILE *f,text_style *ts,char (*format) [3],
               basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
               args)

{
  bool bVar1;
  text_style *in_RSI;
  basic_string_view<char> *in_RDI;
  bool has_style;
  FILE *in_stack_000001d0;
  undefined1 in_stack_000001d8 [16];
  undefined1 in_stack_000001e8 [16];
  FILE *in_stack_ffffffffffffff58;
  color_type in_stack_ffffffffffffff60;
  format_args local_98 [2];
  color_type local_78;
  ansi_color_escape local_70 [20];
  color_type local_5c;
  ansi_color_escape local_51 [20];
  ansi_color_escape local_3d [20];
  byte local_29;
  text_style *local_20;
  basic_string_view<char> *local_18;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  local_10;
  
  local_29 = 0;
  local_20 = in_RSI;
  local_18 = in_RDI;
  bVar1 = text_style::has_emphasis(in_RSI);
  if (bVar1) {
    local_29 = 1;
    text_style::get_emphasis(local_20);
    internal::make_emphasis<char>(in_stack_ffffffffffffff60.value._3_1_);
    internal::ansi_color_escape::operator_cast_to_char_(local_3d);
    internal::fputs<char>((char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  bVar1 = text_style::has_foreground(local_20);
  if (bVar1) {
    local_29 = 1;
    local_5c = text_style::get_foreground(local_20);
    internal::make_foreground_color<char>(in_stack_ffffffffffffff60);
    internal::ansi_color_escape::operator_cast_to_char_(local_51);
    internal::fputs<char>((char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  bVar1 = text_style::has_background(local_20);
  if (bVar1) {
    local_29 = 1;
    local_78 = text_style::get_background(local_20);
    internal::make_background_color<char>(in_stack_ffffffffffffff60);
    internal::ansi_color_escape::operator_cast_to_char_(local_70);
    internal::fputs<char>((char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  basic_string_view<char>::basic_string_view(local_18,(char *)in_stack_ffffffffffffff58);
  format_args::
  format_args<fmt::v5::basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&>
            (local_98,&local_10);
  vprint(in_stack_000001d0,(string_view)in_stack_000001e8,(format_args)in_stack_000001d8);
  if ((local_29 & 1) != 0) {
    internal::reset_color<char>((FILE *)0x14f929);
  }
  return;
}

Assistant:

void vprint(std::FILE *f, const text_style &ts, const S &format,
            basic_format_args<typename buffer_context<Char>::type> args) {
  bool has_style = false;
  if (ts.has_emphasis()) {
    has_style = true;
    internal::fputs<Char>(
          internal::make_emphasis<Char>(ts.get_emphasis()), f);
  }
  if (ts.has_foreground()) {
    has_style = true;
    internal::fputs<Char>(
          internal::make_foreground_color<Char>(ts.get_foreground()), f);
  }
  if (ts.has_background()) {
    has_style = true;
    internal::fputs<Char>(
        internal::make_background_color<Char>(ts.get_background()), f);
  }
  vprint(f, format, args);
  if (has_style) {
    internal::reset_color<Char>(f);
  }
}